

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

BayesianProbitRegressor *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::BayesianProbitRegressor>
          (Arena *arena)

{
  BayesianProbitRegressor *this;
  
  if (arena == (Arena *)0x0) {
    this = (BayesianProbitRegressor *)operator_new(0x78);
    CoreML::Specification::BayesianProbitRegressor::BayesianProbitRegressor(this,(Arena *)0x0,false)
    ;
  }
  else {
    this = (BayesianProbitRegressor *)
           AllocateAlignedWithHook
                     (arena,0x78,
                      (type_info *)&CoreML::Specification::BayesianProbitRegressor::typeinfo);
    CoreML::Specification::BayesianProbitRegressor::BayesianProbitRegressor(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }